

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O1

void processComplexTypeDefinition(XSComplexTypeDefinition *xsComplexTypeDef)

{
  uint uVar1;
  long *plVar2;
  wchar16 *pwVar3;
  char *__s;
  size_t sVar4;
  StrX local_20;
  
  plVar2 = (long *)(**(code **)(*(long *)xsComplexTypeDef + 0x30))();
  if (plVar2 != (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Base:\t\t\t",8);
    pwVar3 = (wchar16 *)(**(code **)(*plVar2 + 0x10))(plVar2);
    __s = (char *)xercesc_4_0::XMLString::transcode
                            (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_20.fLocalForm = __s;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    StrX::~StrX(&local_20);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Content Model:\t",0xf);
  uVar1 = xercesc_4_0::XSComplexTypeDefinition::getContentType();
  if ((uVar1 & 0xfffffffe) == 2) {
    processParticle(*(XSParticle **)(xsComplexTypeDef + 0x60));
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  return;
}

Assistant:

void processComplexTypeDefinition(XSComplexTypeDefinition *xsComplexTypeDef)
{
    XSTypeDefinition *xsBaseTypeDef = xsComplexTypeDef->getBaseType();
    if (xsBaseTypeDef) {
        std::cout << "Base:\t\t\t";
        std::cout << StrX(xsBaseTypeDef->getName()) << "\n";
    }

    std::cout << "Content Model:\t";
    XSComplexTypeDefinition::CONTENT_TYPE contentType = xsComplexTypeDef->getContentType();
    if (contentType == XSComplexTypeDefinition::CONTENTTYPE_ELEMENT ||
        contentType == XSComplexTypeDefinition::CONTENTTYPE_MIXED) {
        processParticle(xsComplexTypeDef->getParticle());
        std::cout << std::endl;
    }
}